

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void nuts_logger(nng_log_level level,nng_log_facility fac,char *msgid,char *msg)

{
  char *pcVar1;
  uint uVar2;
  int color;
  
  uVar2 = level - NNG_LOG_ERR;
  if (uVar2 < 5) {
    pcVar1 = &DAT_001452d0 + *(int *)(&DAT_001452d0 + (ulong)uVar2 * 4);
    color = *(int *)(&DAT_001452e4 + (ulong)uVar2 * 4);
  }
  else {
    color = 0;
    pcVar1 = "LEVEL UNKNOWN";
  }
  acutest_message_color_(color,"%s: %s: %s",pcVar1,msgid,msg);
  return;
}

Assistant:

void
nuts_logger(nng_log_level level, nng_log_facility fac, const char *msgid,
    const char *msg)
{
	(void) fac;
	char *lstr;
	int   color;
	switch (level) {
	case NNG_LOG_DEBUG:
		lstr  = "DEBUG";
		color = NUTS_COLOR_DEFAULT_;
		break;
	case NNG_LOG_INFO:
		lstr  = "INFO";
		color = NUTS_COLOR_DEFAULT_;
		break;
	case NNG_LOG_NOTICE:
		lstr  = "NOTICE";
		color = NUTS_COLOR_DEFAULT_INTENSIVE_;
		break;
	case NNG_LOG_WARN:
		lstr  = "WARNING";
		color = NUTS_COLOR_RED_;
		break;
	case NNG_LOG_ERR:
		lstr  = "ERROR";
		color = NUTS_COLOR_RED_INTENSIVE_;
		break;
	default:
		lstr  = "LEVEL UNKNOWN";
		color = NUTS_COLOR_DEFAULT_;
		break;
	}
	acutest_message_color_(color, "%s: %s: %s", lstr, msgid, msg);
}